

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

void __thiscall ipv4_address::ipv4_address(ipv4_address *this,string *text)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  in_addr tmp;
  stringstream ss;
  ipv4_address local_1c4;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  local_1c4.addr_net = 0;
  iVar1 = inet_pton(2,(text->_M_dataplus)._M_p,&local_1c4);
  if (iVar1 != 0) {
    this->addr_net = (uint32_t)local_1c4;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1c0[0] = (string)0x27;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)local_1c0,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' is not a valid ip address",0x1b);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ipv4_address::ipv4_address(const std::string &text)
{
    in_addr tmp{};
    int res = inet_pton(AF_INET, text.c_str(), &tmp);
    if (res == 0)
    {
        std::stringstream ss;
        ss << '\'' << text << "' is not a valid ip address";
        throw std::runtime_error(ss.str());
    }
    addr_net = tmp.s_addr;
}